

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int i;
  ImGuiTabBar *pIVar1;
  int idx;
  ImPool<ImGuiTabBar> *this_local;
  
  i = this->FreeIdx;
  if (i == (this->Buf).Size) {
    ImVector<ImGuiTabBar>::resize(&this->Buf,(this->Buf).Size + 1);
    this->FreeIdx = this->FreeIdx + 1;
  }
  else {
    pIVar1 = ImVector<ImGuiTabBar>::operator[](&this->Buf,i);
    this->FreeIdx = (pIVar1->Tabs).Size;
  }
  ImVector<ImGuiTabBar>::operator[](&this->Buf,i);
  pIVar1 = (ImGuiTabBar *)operator_new(0x80);
  ImGuiTabBar::ImGuiTabBar(pIVar1);
  pIVar1 = ImVector<ImGuiTabBar>::operator[](&this->Buf,i);
  return pIVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }